

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

IStream * Catch::makeStream(StringRef *filename)

{
  size_type sVar1;
  bool bVar2;
  IStream *pIVar3;
  streambuf *this;
  char *pcVar4;
  IStream *this_00;
  StringRef local_60;
  string local_50;
  ReusableStringStream local_30;
  
  sVar1 = filename->m_size;
  if (sVar1 == 0) {
    pIVar3 = (IStream *)operator_new(0x118);
    pIVar3->_vptr_IStream = (_func_int **)&PTR__CoutStream_005737f8;
    std::ostream::ostream
              (pIVar3 + 1,
               *(streambuf **)(duckdb::Relation::TableFunction + *(long *)(std::cout + -0x18)));
  }
  else {
    pcVar4 = filename->m_start;
    if (*pcVar4 == '%') {
      local_50._M_dataplus._M_p = "%debug";
      local_50._M_string_length = 6;
      bVar2 = StringRef::operator==(filename,(StringRef *)&local_50);
      if (!bVar2) {
        ReusableStringStream::ReusableStringStream(&local_30);
        std::operator<<(local_30.m_oss,"Unrecognised stream: \'");
        operator<<(local_30.m_oss,filename);
        std::operator<<(local_30.m_oss,"\'");
        std::__cxx11::stringbuf::str();
        throw_domain_error(&local_50);
      }
      pIVar3 = (IStream *)operator_new(0x120);
      pIVar3->_vptr_IStream = (_func_int **)&PTR__DebugOutStream_00573838;
      this = (streambuf *)operator_new(0x148);
      std::streambuf::streambuf(this);
      *(undefined ***)this = &PTR__StreamBufImpl_00573878;
      *(streambuf **)(this + 0x28) = this + 0x40;
      *(streambuf **)(this + 0x20) = this + 0x40;
      *(streambuf **)(this + 0x30) = this + 0x140;
      pIVar3[1]._vptr_IStream = (_func_int **)this;
      std::ostream::ostream(pIVar3 + 2,this);
    }
    else {
      pIVar3 = (IStream *)operator_new(0x208);
      pIVar3->_vptr_IStream = (_func_int **)&PTR__FileStream_00573910;
      this_00 = pIVar3 + 1;
      local_60.m_start = pcVar4;
      local_60.m_size = sVar1;
      std::ofstream::ofstream(this_00);
      pcVar4 = StringRef::c_str(&local_60);
      std::ofstream::open((char *)this_00,(_Ios_Openmode)pcVar4);
      if (((byte)this_00->_vptr_IStream[-3][(long)&pIVar3[5]._vptr_IStream] & 5) != 0) {
        ReusableStringStream::ReusableStringStream(&local_30);
        std::operator<<(local_30.m_oss,"Unable to open file: \'");
        operator<<(local_30.m_oss,&local_60);
        std::operator<<(local_30.m_oss,"\'");
        std::__cxx11::stringbuf::str();
        throw_domain_error(&local_50);
      }
    }
  }
  return pIVar3;
}

Assistant:

constexpr auto empty() const noexcept -> bool {
            return m_size == 0;
        }